

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_epsv_disable(Curl_easy *data,connectdata *conn)

{
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((((*(uint *)&(conn->bits).field_0x4 >> 0xc & 1) == 0) ||
      ((*(uint *)&(conn->bits).field_0x4 >> 3 & 1) != 0)) ||
     ((*(uint *)&(conn->bits).field_0x4 >> 1 & 1) != 0)) {
    Curl_infof(data,"Failed EPSV attempt. Disabling EPSV");
    *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffbffff;
    *(uint *)&(data->state).field_0x6d0 = *(uint *)&(data->state).field_0x6d0 & 0xfffffff7;
    data_local._4_4_ = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"%s","PASV");
    if (data_local._4_4_ == CURLE_OK) {
      (conn->proto).ftpc.count1 = (conn->proto).ftpc.count1 + 1;
      _state(data,FTP_PASV);
    }
  }
  else {
    Curl_failf(data,"Failed EPSV attempt, exiting");
    data_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_epsv_disable(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  if(conn->bits.ipv6
#ifndef CURL_DISABLE_PROXY
     && !(conn->bits.tunnel_proxy || conn->bits.socksproxy)
#endif
    ) {
    /* We can't disable EPSV when doing IPv6, so this is instead a fail */
    failf(data, "Failed EPSV attempt, exiting");
    return CURLE_WEIRD_SERVER_REPLY;
  }

  infof(data, "Failed EPSV attempt. Disabling EPSV");
  /* disable it for next transfer */
  conn->bits.ftp_use_epsv = FALSE;
  data->state.errorbuf = FALSE; /* allow error message to get
                                         rewritten */
  result = Curl_pp_sendf(data, &conn->proto.ftpc.pp, "%s", "PASV");
  if(!result) {
    conn->proto.ftpc.count1++;
    /* remain in/go to the FTP_PASV state */
    state(data, FTP_PASV);
  }
  return result;
}